

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::PortConnection::serializeTo(PortConnection *this,ASTSerializer *serializer)

{
  Expression *__n;
  long lVar1;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar2;
  string_view name;
  string_view name_00;
  string_view name_01;
  
  ASTSerializer::write(serializer,4,"port",(size_t)this->port);
  if (this->port->kind == InterfacePort) {
    if (this->connectedSymbol != (Symbol *)0x0) {
      name._M_str = "ifaceInstance";
      name._M_len = 0xd;
      ASTSerializer::writeLink(serializer,name,this->connectedSymbol);
    }
    if (this->modport != (ModportSymbol *)0x0) {
      name_00._M_str = "modport";
      name_00._M_len = 7;
      ASTSerializer::writeLink(serializer,name_00,&this->modport->super_Symbol);
    }
  }
  else {
    __n = getExpression(this);
    if (__n != (Expression *)0x0) {
      ASTSerializer::write(serializer,4,"expr",(size_t)__n);
    }
  }
  sVar2 = Compilation::getAttributes
                    (*(Compilation **)
                      this->port->parentScope->thisSym[1].originatingSyntax[1].parent,this);
  if (sVar2._M_extent._M_extent_value._M_extent_value != 0) {
    name_01._M_str = "attributes";
    name_01._M_len = 10;
    ASTSerializer::startArray(serializer,name_01);
    for (lVar1 = 0; sVar2._M_extent._M_extent_value._M_extent_value << 3 != lVar1; lVar1 = lVar1 + 8
        ) {
      ASTSerializer::serialize(serializer,*(Symbol **)((long)sVar2._M_ptr + lVar1),false);
    }
    ASTSerializer::endArray(serializer);
    return;
  }
  return;
}

Assistant:

void PortConnection::serializeTo(ASTSerializer& serializer) const {
    serializer.write("port", port);
    if (port.kind == SymbolKind::InterfacePort) {
        if (connectedSymbol)
            serializer.writeLink("ifaceInstance", *connectedSymbol);
        if (modport)
            serializer.writeLink("modport", *modport);
    }
    else {
        if (auto e = getExpression())
            serializer.write("expr", *e);
    }

    auto& parentInstance = getParentInstance();
    auto scope = parentInstance.getParentScope();
    SLANG_ASSERT(scope);

    auto attributes = scope->getCompilation().getAttributes(*this);
    if (!attributes.empty()) {
        serializer.startArray("attributes");
        for (auto attr : attributes)
            serializer.serialize(*attr);
        serializer.endArray();
    }
}